

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quadtree.h
# Opt level: O0

void __thiscall
quadtree::
Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>
::removeValue(Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
              *this,Node *node,Node **value)

{
  value_type pNVar1;
  anon_class_16_2_f8a5d25e_for__M_pred __pred;
  iterator __first;
  iterator __last;
  reference ppNVar2;
  reference ppNVar3;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_28;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> it;
  Node **value_local;
  Node *node_local;
  Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
  *this_local;
  
  it._M_current = value;
  __first = std::begin<std::vector<Node*,std::allocator<Node*>>>(&node->values);
  __last = std::end<std::vector<Node*,std::allocator<Node*>>>(&node->values);
  __pred.value = it._M_current;
  __pred.this = this;
  local_28 = std::
             find_if<__gnu_cxx::__normal_iterator<Node**,std::vector<Node*,std::allocator<Node*>>>,quadtree::Quadtree<Node*,main::__0,std::equal_to<Node*>,float>::removeValue(quadtree::Quadtree<Node*,main::__0,std::equal_to<Node*>,float>::Node*,Node*const&)::_lambda(auto:1_const&)_1_>
                       (__first._M_current,__last._M_current,__pred);
  ppNVar2 = std::vector<Node_*,_std::allocator<Node_*>_>::back(&node->values);
  pNVar1 = *ppNVar2;
  ppNVar3 = __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
            operator*(&local_28);
  *ppNVar3 = pNVar1;
  std::vector<Node_*,_std::allocator<Node_*>_>::pop_back(&node->values);
  return;
}

Assistant:

void removeValue(Node* node, const T& value)
    {
        // Find the value in node->values
        auto it = std::find_if(std::begin(node->values), std::end(node->values),
            [this, &value](const auto& rhs){ return mEqual(value, rhs); });
        assert(it != std::end(node->values) && "Trying to remove a value that is not present in the node");
        // Swap with the last element and pop back
        *it = std::move(node->values.back());
        node->values.pop_back();
    }